

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstorageinfo.cpp
# Opt level: O2

QDebug operator<<(QDebug debug,QStorageInfo *s)

{
  long lVar1;
  long lVar2;
  QStorageInfoPrivate *pQVar3;
  QDebug *pQVar4;
  long *in_RDX;
  char *t;
  QStorageInfoPrivate *d;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  saver.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)s);
  *(undefined2 *)&(((s->d).d.ptr)->device).d.size = 0x100;
  QDebug::operator<<((QDebug *)s,"QStorageInfo(");
  lVar2 = *in_RDX;
  if (*(char *)(lVar2 + 0x9e) == '\x01') {
    pQVar4 = QDebug::operator<<((QDebug *)s,'\"');
    pQVar4 = QDebug::operator<<(pQVar4,(QString *)(lVar2 + 8));
    QDebug::operator<<(pQVar4,'\"');
    if (*(long *)(lVar2 + 0x60) != 0) {
      pQVar4 = QDebug::operator<<((QDebug *)s,", type=");
      QDebug::operator<<(pQVar4,(QByteArray *)(lVar2 + 0x50));
    }
    if (*(long *)(lVar2 + 0x78) != 0) {
      pQVar4 = QDebug::operator<<((QDebug *)s,", name=\"");
      pQVar4 = QDebug::operator<<(pQVar4,(QString *)(lVar2 + 0x68));
      QDebug::operator<<(pQVar4,'\"');
    }
    if (*(long *)(lVar2 + 0x30) != 0) {
      pQVar4 = QDebug::operator<<((QDebug *)s,", device=\"");
      pQVar4 = QDebug::operator<<(pQVar4,(QByteArray *)(lVar2 + 0x20));
      QDebug::operator<<(pQVar4,'\"');
    }
    if (*(long *)(lVar2 + 0x48) != 0) {
      pQVar4 = QDebug::operator<<((QDebug *)s,", subvolume=\"");
      pQVar4 = QDebug::operator<<(pQVar4,(QByteArray *)(lVar2 + 0x38));
      QDebug::operator<<(pQVar4,'\"');
    }
    if (*(char *)(lVar2 + 0x9c) == '\x01') {
      QDebug::operator<<((QDebug *)s," [read only]");
    }
    t = " [not ready]";
    if (*(char *)(lVar2 + 0x9d) != '\0') {
      t = " [ready]";
    }
    QDebug::operator<<((QDebug *)s,t);
    if (0 < *(long *)(lVar2 + 0x80)) {
      pQVar4 = QDebug::operator<<((QDebug *)s,", bytesTotal=");
      pQVar4 = QDebug::operator<<(pQVar4,*(qint64 *)(lVar2 + 0x80));
      pQVar4 = QDebug::operator<<(pQVar4,", bytesFree=");
      pQVar4 = QDebug::operator<<(pQVar4,*(qint64 *)(lVar2 + 0x88));
      pQVar4 = QDebug::operator<<(pQVar4,", bytesAvailable=");
      QDebug::operator<<(pQVar4,*(qint64 *)(lVar2 + 0x90));
    }
  }
  else {
    QDebug::operator<<((QDebug *)s,"invalid");
  }
  QDebug::operator<<((QDebug *)s,')');
  pQVar3 = (s->d).d.ptr;
  (s->d).d.ptr = (QStorageInfoPrivate *)0x0;
  ((debug.stream)->ts)._vptr_QTextStream = (_func_int **)pQVar3;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, const QStorageInfo &s)
{
    QDebugStateSaver saver(debug);
    debug.nospace();
    debug.noquote();
    debug << "QStorageInfo(";
    if (s.isValid()) {
        const QStorageInfoPrivate *d = s.d.constData();
        debug << '"' << d->rootPath << '"';
        if (!d->fileSystemType.isEmpty())
            debug << ", type=" << d->fileSystemType;
        if (!d->name.isEmpty())
            debug << ", name=\"" << d->name << '"';
        if (!d->device.isEmpty())
            debug << ", device=\"" << d->device << '"';
        if (!d->subvolume.isEmpty())
            debug << ", subvolume=\"" << d->subvolume << '"';
        if (d->readOnly)
            debug << " [read only]";
        debug << (d->ready ? " [ready]" : " [not ready]");
        if (d->bytesTotal > 0) {
            debug << ", bytesTotal=" << d->bytesTotal << ", bytesFree=" << d->bytesFree
                  << ", bytesAvailable=" << d->bytesAvailable;
        }
    } else {
        debug << "invalid";
    }
    debug << ')';
    return debug;
}